

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

Ptr __thiscall Polymer::FindBindingSite(Polymer *this,Ptr *pol,string *promoter_name)

{
  pointer pIVar1;
  __type _Var2;
  bool bVar3;
  runtime_error *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<BindingSite> *__x;
  Ptr PVar5;
  VecPtr promoter_choices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  promoter_choices.
  super__Vector_base<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  promoter_choices.
  super__Vector_base<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  promoter_choices.
  super__Vector_base<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            ((IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)
             &pol[0x14].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (long)*(int *)&pol[8].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,
             (long)*(int *)&pol[0x1e].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,&results);
  pIVar1 = results.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = false;
  for (__x = &(results.
               super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->value;
      (Interval<std::shared_ptr<BindingSite>,_unsigned_long> *)(__x + -1) != pIVar1; __x = __x + 2)
  {
    _Var2 = std::operator==(&(((__x->super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->super_FixedElement).name_,in_RCX);
    if ((_Var2) &&
       ((((__x->super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_FixedElement).covered_ < 1)) {
      bVar3 = true;
      std::vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>::
      push_back(&promoter_choices,__x);
    }
  }
  if (bVar3) {
    Random::WeightedChoice<std::shared_ptr<BindingSite>>((Random *)this,&promoter_choices);
    bVar3 = BindingSite::CheckInteraction
                      ((BindingSite *)this->_vptr_Polymer,
                       (string *)((promoter_name->_M_dataplus)._M_p + 0x18));
    if (bVar3) {
      std::
      vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
      ::~vector(&results);
      std::vector<std::shared_ptr<BindingSite>,_std::allocator<std::shared_ptr<BindingSite>_>_>::
      ~vector(&promoter_choices);
      PVar5.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      PVar5.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Ptr)PVar5.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::operator+(&local_e8,"Polymerase ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((promoter_name->_M_dataplus)._M_p + 0x18));
    std::operator+(&local_c8,&local_e8," does not interact with promoter ");
    std::operator+(&err,&local_c8,in_RCX);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,(string *)&err);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+(&local_70,"Polymerase ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((promoter_name->_M_dataplus)._M_p + 0x18));
  std::operator+(&local_50,&local_70," could not find free promoter ");
  std::operator+(&local_e8,&local_50,in_RCX);
  std::operator+(&local_c8,&local_e8," to bind in the polymer ");
  std::operator+(&err,&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &pol[6].super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,(string *)&err);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BindingSite::Ptr Polymer::FindBindingSite(MobileElement::Ptr pol,
                                          const std::string &promoter_name) {
  // Make a list of free promoters that pol can bind
  bool found = false;
  BindingSite::VecPtr promoter_choices;
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(start_, mask_.start(), results);
  for (auto &interval : results) {
    if (interval.value->name() == promoter_name &&
        !interval.value->IsCovered()) {
      promoter_choices.push_back(interval.value);
      found = true;
    }
  }
  // Error checking
  if (!found) {
    std::string err = "Polymerase " + pol->name() +
                      " could not find free promoter " + promoter_name +
                      " to bind in the polymer " + name_;
    throw std::runtime_error(err);
  }
  // Randomly select promoter.
  BindingSite::Ptr elem = Random::WeightedChoice(promoter_choices);
  // More error checking.
  if (!elem->CheckInteraction(pol->name())) {
    std::string err = "Polymerase " + pol->name() +
                      " does not interact with promoter " + promoter_name;
    throw std::runtime_error(err);
  }
  return elem;
}